

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg.h
# Opt level: O0

svg * __thiscall
svg::attribute<char[3]>(svg *this,string *attribute_name,char (*value) [3],string *unit)

{
  ostream *poVar1;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [376];
  string *local_28;
  string *unit_local;
  char (*value_local) [3];
  string *attribute_name_local;
  
  local_28 = unit;
  unit_local = (string *)value;
  value_local = (char (*) [3])attribute_name;
  attribute_name_local = (string *)this;
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = std::operator<<(local_1a0,(string *)value_local);
  poVar1 = std::operator<<(poVar1,"=\"");
  poVar1 = std::operator<<(poVar1,(char *)unit_local);
  poVar1 = std::operator<<(poVar1,(string *)local_28);
  std::operator<<(poVar1,"\" ");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return this;
}

Assistant:

std::string attribute(std::string const & attribute_name,
        T const & value, std::string const & unit = "")
    {
        std::stringstream ss;
        ss << attribute_name << "=\"" << value << unit << "\" ";
        return ss.str();
    }